

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O0

int cgltf_parse_json_clearcoat
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,
              cgltf_clearcoat *out_clearcoat)

{
  int iVar1;
  int iVar2;
  cgltf_float cVar3;
  int local_40;
  int j;
  int size;
  cgltf_clearcoat *out_clearcoat_local;
  uint8_t *json_chunk_local;
  int i_local;
  jsmntok_t *tokens_local;
  cgltf_options *options_local;
  
  if (tokens[i].type == JSMN_OBJECT) {
    iVar1 = tokens[i].size;
    json_chunk_local._4_4_ = i + 1;
    for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
      if ((tokens[json_chunk_local._4_4_].type != JSMN_STRING) ||
         (tokens[json_chunk_local._4_4_].size == 0)) {
        return -1;
      }
      iVar2 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,"clearcoatFactor");
      if (iVar2 == 0) {
        cVar3 = cgltf_json_to_float(tokens + (json_chunk_local._4_4_ + 1),json_chunk);
        out_clearcoat->clearcoat_factor = cVar3;
        json_chunk_local._4_4_ = json_chunk_local._4_4_ + 2;
      }
      else {
        iVar2 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,
                                  "clearcoatRoughnessFactor");
        if (iVar2 == 0) {
          cVar3 = cgltf_json_to_float(tokens + (json_chunk_local._4_4_ + 1),json_chunk);
          out_clearcoat->clearcoat_roughness_factor = cVar3;
          json_chunk_local._4_4_ = json_chunk_local._4_4_ + 2;
        }
        else {
          iVar2 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,"clearcoatTexture");
          if (iVar2 == 0) {
            json_chunk_local._4_4_ =
                 cgltf_parse_json_texture_view
                           (options,tokens,json_chunk_local._4_4_ + 1,json_chunk,
                            &out_clearcoat->clearcoat_texture);
          }
          else {
            iVar2 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,
                                      "clearcoatRoughnessTexture");
            if (iVar2 == 0) {
              json_chunk_local._4_4_ =
                   cgltf_parse_json_texture_view
                             (options,tokens,json_chunk_local._4_4_ + 1,json_chunk,
                              &out_clearcoat->clearcoat_roughness_texture);
            }
            else {
              iVar2 = cgltf_json_strcmp(tokens + json_chunk_local._4_4_,json_chunk,
                                        "clearcoatNormalTexture");
              if (iVar2 == 0) {
                json_chunk_local._4_4_ =
                     cgltf_parse_json_texture_view
                               (options,tokens,json_chunk_local._4_4_ + 1,json_chunk,
                                &out_clearcoat->clearcoat_normal_texture);
              }
              else {
                json_chunk_local._4_4_ = cgltf_skip_json(tokens,json_chunk_local._4_4_ + 1);
              }
            }
          }
        }
      }
      if (json_chunk_local._4_4_ < 0) {
        return json_chunk_local._4_4_;
      }
    }
    options_local._4_4_ = json_chunk_local._4_4_;
  }
  else {
    options_local._4_4_ = -1;
  }
  return options_local._4_4_;
}

Assistant:

static int cgltf_parse_json_clearcoat(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_clearcoat* out_clearcoat)
{
	CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);
	int size = tokens[i].size;
	++i;

	for (int j = 0; j < size; ++j)
	{
		CGLTF_CHECK_KEY(tokens[i]);

		if (cgltf_json_strcmp(tokens+i, json_chunk, "clearcoatFactor") == 0)
		{
			++i;
			out_clearcoat->clearcoat_factor = cgltf_json_to_float(tokens + i, json_chunk);
			++i;
		}
		else if (cgltf_json_strcmp(tokens+i, json_chunk, "clearcoatRoughnessFactor") == 0)
		{
			++i;
			out_clearcoat->clearcoat_roughness_factor = cgltf_json_to_float(tokens + i, json_chunk);
			++i;
		}
		else if (cgltf_json_strcmp(tokens+i, json_chunk, "clearcoatTexture") == 0)
		{
			i = cgltf_parse_json_texture_view(options, tokens, i + 1, json_chunk, &out_clearcoat->clearcoat_texture);
		}
		else if (cgltf_json_strcmp(tokens+i, json_chunk, "clearcoatRoughnessTexture") == 0)
		{
			i = cgltf_parse_json_texture_view(options, tokens, i + 1, json_chunk, &out_clearcoat->clearcoat_roughness_texture);
		}
		else if (cgltf_json_strcmp(tokens+i, json_chunk, "clearcoatNormalTexture") == 0)
		{
			i = cgltf_parse_json_texture_view(options, tokens, i + 1, json_chunk, &out_clearcoat->clearcoat_normal_texture);
		}
		else
		{
			i = cgltf_skip_json(tokens, i+1);
		}

		if (i < 0)
		{
			return i;
		}
	}

	return i;
}